

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

char * gl4cts::TextureViewUtilities::getGLSLTypeForSamplerType(_sampler_type sampler_type)

{
  TestError *this;
  char *local_18;
  char *result;
  _sampler_type sampler_type_local;
  
  if (sampler_type == SAMPLER_TYPE_FLOAT) {
    local_18 = "sampler2D";
  }
  else if (sampler_type == SAMPLER_TYPE_SIGNED_INTEGER) {
    local_18 = "isampler2D";
  }
  else {
    if (sampler_type != SAMPLER_TYPE_UNSIGNED_INTEGER) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Unrecognized sampler type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x4a9);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_18 = "usampler2D";
  }
  return local_18;
}

Assistant:

const char* TextureViewUtilities::getGLSLTypeForSamplerType(const _sampler_type sampler_type)
{
	const char* result = "";

	switch (sampler_type)
	{
	case SAMPLER_TYPE_FLOAT:
		result = "sampler2D";
		break;
	case SAMPLER_TYPE_SIGNED_INTEGER:
		result = "isampler2D";
		break;
	case SAMPLER_TYPE_UNSIGNED_INTEGER:
		result = "usampler2D";
		break;

	default:
	{
		TCU_FAIL("Unrecognized sampler type");
	}
	} /* switch (sampler_type) */

	return result;
}